

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O0

bool __thiscall slang::ast::CoverageOptionSetter::isTypeOption(CoverageOptionSetter *this)

{
  bool bVar1;
  CoverageOptionSyntax *pCVar2;
  ExpressionSyntax *pEVar3;
  SyntaxNode *pSVar4;
  BinaryExpressionSyntax *pBVar5;
  ScopedNameSyntax *pSVar6;
  NameSyntax *pNVar7;
  IdentifierNameSyntax *pIVar8;
  string_view __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  ScopedNameSyntax *scoped;
  BinaryExpressionSyntax *assign;
  CoverageOptionSetter *this_local;
  
  pCVar2 = not_null<const_slang::syntax::CoverageOptionSyntax_*>::operator->(&this->syntax);
  pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator->(&pCVar2->expr);
  if ((pEVar3->super_SyntaxNode).kind == AssignmentExpression) {
    pCVar2 = not_null<const_slang::syntax::CoverageOptionSyntax_*>::operator->(&this->syntax);
    pSVar4 = &not_null<slang::syntax::ExpressionSyntax_*>::operator->(&pCVar2->expr)->
              super_SyntaxNode;
    pBVar5 = slang::syntax::SyntaxNode::as<slang::syntax::BinaryExpressionSyntax>(pSVar4);
    pEVar3 = not_null<slang::syntax::ExpressionSyntax_*>::operator->(&pBVar5->left);
    if ((pEVar3->super_SyntaxNode).kind == ScopedName) {
      pSVar4 = &not_null<slang::syntax::ExpressionSyntax_*>::operator->(&pBVar5->left)->
                super_SyntaxNode;
      pSVar6 = slang::syntax::SyntaxNode::as<slang::syntax::ScopedNameSyntax>(pSVar4);
      pNVar7 = not_null<slang::syntax::NameSyntax_*>::operator->(&pSVar6->left);
      if ((pNVar7->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName) {
        pSVar4 = (SyntaxNode *)not_null<slang::syntax::NameSyntax_*>::operator->(&pSVar6->left);
        pIVar8 = slang::syntax::SyntaxNode::as<slang::syntax::IdentifierNameSyntax>(pSVar4);
        __x = parsing::Token::valueText(&pIVar8->identifier);
        __y = sv("type_option",0xb);
        bVar1 = std::operator==(__x,__y);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool CoverageOptionSetter::isTypeOption() const {
    if (syntax->expr->kind == SyntaxKind::AssignmentExpression) {
        auto& assign = syntax->expr->as<BinaryExpressionSyntax>();
        if (assign.left->kind == SyntaxKind::ScopedName) {
            auto& scoped = assign.left->as<ScopedNameSyntax>();
            if (scoped.left->kind == SyntaxKind::IdentifierName) {
                return scoped.left->as<IdentifierNameSyntax>().identifier.valueText() ==
                       "type_option"sv;
            }
        }
    }
    return false;
}